

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktRenderPassTests.cpp
# Opt level: O0

VkClearValue vkt::anon_unknown_0::randomClearValue(Attachment *attachment,Random *rng)

{
  VkClearValue VVar1;
  bool bVar2;
  VkFormat format_00;
  TextureFormat TVar3;
  VkClearColorValue VVar4;
  ChannelType local_4c;
  VkClearDepthStencilValue local_40;
  ChannelOrder local_38;
  TextureFormat format;
  float clearNan;
  Random *rng_local;
  Attachment *attachment_local;
  VkClearValue clearValue;
  
  tcu::Float<unsigned_int,_8,_23,_127,_3U>::nan((char *)attachment);
  format.type = (ChannelType)
                tcu::Float<unsigned_int,_8,_23,_127,_3U>::asFloat
                          ((Float<unsigned_int,_8,_23,_127,_3U> *)&format);
  format_00 = Attachment::getFormat(attachment);
  TVar3 = ::vk::mapVkFormat(format_00);
  local_38 = TVar3.order;
  bVar2 = tcu::hasStencilComponent(local_38);
  if ((bVar2) || (bVar2 = tcu::hasDepthComponent(local_38), bVar2)) {
    attachment_local._0_4_ = format.type;
    attachment_local._4_4_ = 0xcd;
    bVar2 = tcu::hasStencilComponent(local_38);
    if (bVar2) {
      bVar2 = de::Random::getBool(rng);
      attachment_local._4_4_ = 0;
      if (bVar2) {
        attachment_local._4_4_ = 0xff;
      }
    }
    bVar2 = tcu::hasDepthComponent(local_38);
    if (bVar2) {
      bVar2 = de::Random::getBool(rng);
      local_4c = 0x3f800000;
      if (!bVar2) {
        local_4c = SNORM_INT8;
      }
      attachment_local._0_4_ = local_4c;
    }
  }
  else {
    VVar4 = randomColorClearValue(attachment,rng);
    attachment_local._0_4_ = VVar4.int32[0];
    attachment_local._4_4_ = VVar4.int32[1];
    local_40 = VVar4._8_8_;
    clearValue.depthStencil = local_40;
  }
  VVar1.depthStencil.stencil = attachment_local._4_4_;
  VVar1.depthStencil.depth = (float)(ChannelType)attachment_local;
  VVar1._8_4_ = clearValue._0_4_;
  VVar1._12_4_ = clearValue._4_4_;
  return VVar1;
}

Assistant:

VkClearValue randomClearValue (const Attachment& attachment, de::Random& rng)
{
	const float					clearNan	= tcu::Float32::nan().asFloat();
	const tcu::TextureFormat	format		= mapVkFormat(attachment.getFormat());

	if (tcu::hasStencilComponent(format.order) || tcu::hasDepthComponent(format.order))
	{
		VkClearValue clearValue;

		clearValue.depthStencil.depth	= clearNan;
		clearValue.depthStencil.stencil	= 0xCDu;

		if (tcu::hasStencilComponent(format.order))
			clearValue.depthStencil.stencil	= rng.getBool()
											? 0xFFu
											: 0x0u;

		if (tcu::hasDepthComponent(format.order))
			clearValue.depthStencil.depth	= rng.getBool()
											? 1.0f
											: 0.0f;

		return clearValue;
	}
	else
	{
		VkClearValue clearValue;

		clearValue.color = randomColorClearValue(attachment, rng);

		return clearValue;
	}
}